

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_cTest.cpp
# Opt level: O2

void __thiscall
TEST_MockSupport_c_returnDoubleValue_Test::testBody(TEST_MockSupport_c_returnDoubleValue_Test *this)

{
  MockSupport_c *pMVar1;
  MockExpectedCall_c *pMVar2;
  UtestShell *pUVar3;
  MockActualCall_c *pMVar4;
  TestTerminator *pTVar5;
  double dVar6;
  MockValue_c MVar7;
  
  pMVar1 = mock_c();
  pMVar2 = (*pMVar1->expectOneCall)("boo");
  (*pMVar2->andReturnDoubleValue)(1.0);
  pUVar3 = UtestShell::getCurrent();
  pMVar1 = mock_c();
  pMVar4 = (*pMVar1->actualCall)("boo");
  dVar6 = (*pMVar4->doubleReturnValue)();
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0x15])
            (0x3ff0000000000000,dVar6,0x3f747ae147ae147b,pUVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupport_cTest.cpp"
             ,0x1c8,pTVar5);
  pUVar3 = UtestShell::getCurrent();
  pMVar1 = mock_c();
  dVar6 = (*pMVar1->doubleReturnValue)();
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0x15])
            (0x3ff0000000000000,dVar6,0x3f747ae147ae147b,pUVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupport_cTest.cpp"
             ,0x1c9,pTVar5);
  pUVar3 = UtestShell::getCurrent();
  pMVar1 = mock_c();
  MVar7 = (*pMVar1->returnValue)();
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,7,(ulong)MVar7.type,
             "LONGS_EQUAL(MOCKVALUETYPE_DOUBLE, mock_c()->returnValue().type) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupport_cTest.cpp"
             ,0x1ca,pTVar5);
  return;
}

Assistant:

TEST(MockSupport_c, returnDoubleValue)
{
    mock_c()->expectOneCall("boo")->andReturnDoubleValue(1.0);
    DOUBLES_EQUAL(1.0, mock_c()->actualCall("boo")->doubleReturnValue(), 0.005);
    DOUBLES_EQUAL(1.0, mock_c()->doubleReturnValue(), 0.005);
    LONGS_EQUAL(MOCKVALUETYPE_DOUBLE, mock_c()->returnValue().type);
}